

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O0

bool __thiscall
greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t,_directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t_&>
::operator()(greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t,_directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t_&>
             *this,filtration_index_t a,filtration_index_t b)

{
  int iVar1;
  ulong uVar2;
  index_t iVar3;
  index_t iVar4;
  __tuple_element_t<0UL,_tuple<unsigned_long,_unsigned_long,_int>_> *p_Var5;
  __tuple_element_t<2UL,_tuple<unsigned_long,_unsigned_long,_int>_> *p_Var6;
  __tuple_element_t<1UL,_tuple<unsigned_long,_unsigned_long,_int>_> *p_Var7;
  pair<float,_int> in_RDX;
  pair<float,_int> in_RSI;
  value_t vVar8;
  value_t vVar9;
  tuple<unsigned_long,_unsigned_long,_int> *tb;
  tuple<unsigned_long,_unsigned_long,_int> *ta;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  pair<float,_int> in_stack_ffffffffffffff10;
  __tuple_element_t<1UL,_tuple<unsigned_long,_unsigned_long,_int>_> _Var10;
  greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t,_directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t_&>
  *in_stack_ffffffffffffff70;
  pair<float,_int> in_stack_ffffffffffffff78;
  undefined1 local_60 [24];
  undefined1 *local_48;
  pair<float,_int> local_40;
  pair<float,_int> local_38;
  pair<float,_int> local_30;
  pair<float,_int> local_14;
  pair<float,_int> local_c;
  bool local_1;
  
  local_14 = in_RDX;
  local_c = in_RSI;
  vVar8 = get_filtration((filtration_index_t)in_RSI);
  local_30 = local_14;
  vVar9 = get_filtration((filtration_index_t)local_14);
  if (vVar8 <= vVar9) {
    local_38 = local_c;
    vVar8 = get_filtration((filtration_index_t)local_c);
    local_40 = local_14;
    vVar9 = get_filtration((filtration_index_t)local_14);
    if (vVar9 <= vVar8) {
      filtration_entry_t::filtration_entry_t
                ((filtration_entry_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
                 ,(filtration_index_t)in_stack_ffffffffffffff10);
      get_coboundary_size_and_gap_and_pivot
                (in_stack_ffffffffffffff70,(filtration_entry_t)in_stack_ffffffffffffff78);
      local_48 = local_60;
      filtration_entry_t::filtration_entry_t
                ((filtration_entry_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
                 ,(filtration_index_t)in_stack_ffffffffffffff10);
      get_coboundary_size_and_gap_and_pivot
                (in_stack_ffffffffffffff70,(filtration_entry_t)in_stack_ffffffffffffff78);
      p_Var5 = std::get<0ul,unsigned_long,unsigned_long,int>
                         ((tuple<unsigned_long,_unsigned_long,_int> *)0x1c98e8);
      uVar2 = *p_Var5;
      p_Var5 = std::get<0ul,unsigned_long,unsigned_long,int>
                         ((tuple<unsigned_long,_unsigned_long,_int> *)0x1c98fd);
      if (uVar2 < *p_Var5) {
        local_1 = true;
      }
      else {
        p_Var5 = std::get<0ul,unsigned_long,unsigned_long,int>
                           ((tuple<unsigned_long,_unsigned_long,_int> *)0x1c9924);
        uVar2 = *p_Var5;
        p_Var5 = std::get<0ul,unsigned_long,unsigned_long,int>
                           ((tuple<unsigned_long,_unsigned_long,_int> *)0x1c9939);
        if (*p_Var5 < uVar2) {
          local_1 = false;
        }
        else {
          p_Var6 = std::get<2ul,unsigned_long,unsigned_long,int>
                             ((tuple<unsigned_long,_unsigned_long,_int> *)0x1c9960);
          iVar1 = *p_Var6;
          p_Var6 = std::get<2ul,unsigned_long,unsigned_long,int>
                             ((tuple<unsigned_long,_unsigned_long,_int> *)0x1c9973);
          if (iVar1 < *p_Var6) {
            local_1 = true;
          }
          else {
            p_Var6 = std::get<2ul,unsigned_long,unsigned_long,int>
                               ((tuple<unsigned_long,_unsigned_long,_int> *)0x1c9998);
            iVar1 = *p_Var6;
            p_Var6 = std::get<2ul,unsigned_long,unsigned_long,int>
                               ((tuple<unsigned_long,_unsigned_long,_int> *)0x1c99ab);
            if (*p_Var6 < iVar1) {
              local_1 = false;
            }
            else {
              p_Var7 = std::get<1ul,unsigned_long,unsigned_long,int>
                                 ((tuple<unsigned_long,_unsigned_long,_int> *)0x1c99d0);
              uVar2 = *p_Var7;
              p_Var7 = std::get<1ul,unsigned_long,unsigned_long,int>
                                 ((tuple<unsigned_long,_unsigned_long,_int> *)0x1c99e5);
              if (*p_Var7 < uVar2) {
                local_1 = true;
              }
              else {
                p_Var7 = std::get<1ul,unsigned_long,unsigned_long,int>
                                   ((tuple<unsigned_long,_unsigned_long,_int> *)0x1c9a09);
                _Var10 = *p_Var7;
                p_Var7 = std::get<1ul,unsigned_long,unsigned_long,int>
                                   ((tuple<unsigned_long,_unsigned_long,_int> *)0x1c9a1e);
                if (_Var10 < *p_Var7) {
                  local_1 = false;
                }
                else {
                  iVar3 = get_index((filtration_index_t)local_c);
                  iVar4 = get_index((filtration_index_t)local_14);
                  local_1 = iVar3 < iVar4;
                }
              }
            }
          }
        }
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool operator()(Entry a, Entry b) const {
		// First order by the filtration value
		if (get_filtration(a) > get_filtration(b)) return true;
		if (get_filtration(a) < get_filtration(b)) return false;

		const auto& ta = get_coboundary_size_and_gap_and_pivot(a);
		const auto& tb = get_coboundary_size_and_gap_and_pivot(b);

		// Then the number of non-trivial coboundary entries
		if (std::get<0>(ta) < std::get<0>(tb)) return true;
		if (std::get<0>(ta) > std::get<0>(tb)) return false;

		// Then order by the better pivoting
		if (std::get<2>(ta) < std::get<2>(tb)) return true;
		if (std::get<2>(ta) > std::get<2>(tb)) return false;

		if (std::get<1>(ta) > std::get<1>(tb)) return true;
		if (std::get<1>(ta) < std::get<1>(tb)) return false;

		// Finally, order by their indices
		return get_index(a) < get_index(b);
	}